

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O3

Real Q_GetEl(QMatrix *Q,size_t Row,size_t Clm)

{
  ElOrderType EVar1;
  LASErrIdType LVar2;
  size_t sVar3;
  Real *pRVar4;
  Real RVar5;
  
  LVar2 = LASResult();
  RVar5 = 0.0;
  if (LVar2 != LASOK) {
    return 0.0;
  }
  if ((Row == 0) || (Q->Dim <= Clm - 1 || Q->Dim < Row)) {
    LASError(LASRangeErr,"Q_GetEl",Q->Name,(char *)0x0,(char *)0x0);
    return 0.0;
  }
  EVar1 = Q->ElOrder;
  if (Q->Symmetry == False) {
    if (EVar1 == Rowws) {
      sVar3 = Q->Len[Row];
      if (sVar3 != 0) {
        pRVar4 = &Q->El[Row]->Val;
        do {
          if (((ElType *)(pRVar4 + -1))->Pos == Clm) {
            RVar5 = *pRVar4;
          }
          pRVar4 = pRVar4 + 2;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
    }
    else if ((EVar1 == Clmws) && (sVar3 = Q->Len[Clm], sVar3 != 0)) {
      pRVar4 = &Q->El[Clm]->Val;
      do {
        if (((ElType *)(pRVar4 + -1))->Pos == Row) {
          RVar5 = *pRVar4;
        }
        pRVar4 = pRVar4 + 2;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
  }
  else if (EVar1 == Rowws) {
    if (Clm < Row) {
      sVar3 = Q->Len[Clm];
      if (sVar3 == 0) goto LAB_0010eab9;
      pRVar4 = &Q->El[Clm]->Val;
      do {
        if (((ElType *)(pRVar4 + -1))->Pos == Row) {
          RVar5 = *pRVar4;
        }
        pRVar4 = pRVar4 + 2;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    else {
      sVar3 = Q->Len[Row];
      if (sVar3 != 0) {
        pRVar4 = &Q->El[Row]->Val;
        do {
          if (((ElType *)(pRVar4 + -1))->Pos == Clm) {
            RVar5 = *pRVar4;
          }
          pRVar4 = pRVar4 + 2;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
    }
  }
  else if (EVar1 == Clmws) {
    if (Clm < Row) {
      sVar3 = Q->Len[Row];
      if (sVar3 == 0) goto LAB_0010eab9;
      pRVar4 = &Q->El[Row]->Val;
      do {
        if (((ElType *)(pRVar4 + -1))->Pos == Clm) {
          RVar5 = *pRVar4;
        }
        pRVar4 = pRVar4 + 2;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    else {
      sVar3 = Q->Len[Clm];
      if (sVar3 != 0) {
        pRVar4 = &Q->El[Clm]->Val;
        do {
          if (((ElType *)(pRVar4 + -1))->Pos == Row) {
            RVar5 = *pRVar4;
          }
          pRVar4 = pRVar4 + 2;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
    }
  }
  if (Row == 1) {
    RVar5 = RVar5 * Q->MultiplD;
  }
LAB_0010eab9:
  if (Clm < Row) {
    RVar5 = RVar5 * Q->MultiplU * Q->MultiplL;
  }
  return RVar5;
}

Assistant:

Real Q_GetEl(QMatrix *Q, size_t Row, size_t Clm)
/* returns the value of a matrix element (all matrix elements are considered) */
{
    Real Val;
    
    size_t Len, ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Row > 0 && Row <= Q->Dim && Clm > 0 && Clm <= Q->Dim) {
            Val = 0.0;
            if (Q->Symmetry && Q->ElOrder == Rowws) {
                if (Clm >= Row) {
                    Len = Q->Len[Row];
                    PtrEl = Q->El[Row];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Clm)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                } else {
                    Len = Q->Len[Clm];
                    PtrEl = Q->El[Clm];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Row)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                }
            } else if (Q->Symmetry && Q->ElOrder == Clmws) {
                if (Clm >= Row) {
                    Len = Q->Len[Clm];
                    PtrEl = Q->El[Clm];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Row)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                } else {
                    Len = Q->Len[Row];
                    PtrEl = Q->El[Row];
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        if ((*PtrEl).Pos == Clm)
                            Val = (*PtrEl).Val;
                        PtrEl++;
                    }
                }
            } else if (!Q->Symmetry && Q->ElOrder == Rowws) {
                Len = Q->Len[Row];
                PtrEl = Q->El[Row];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Clm)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            } else if (!Q->Symmetry && Q->ElOrder == Clmws) {
                Len = Q->Len[Clm];
                PtrEl = Q->El[Clm];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Row)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            }

            if (Row == Clmws)
                Val *= Q->MultiplD;
            if (Row > Clm)
                Val *= Q->MultiplU;
            if (Row > Clm)
                Val *= Q->MultiplL;
        } else {
            LASError(LASRangeErr, "Q_GetEl", Q->Name, NULL, NULL);
            Val = 0.0;
        }
    } else {
        Val = 0.0;
    }
    return(Val);
}